

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O0

void __thiscall
pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::clear
          (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *this)

{
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *this_local;
  
  std::__cxx11::
  list<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ::clear(&this->chunks_);
  std::__cxx11::
  list<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ::emplace_back<>(&this->chunks_);
  this->size_ = 0;
  return;
}

Assistant:

void clear () {
            chunks_.clear ();
            // Ensure that there's always at least one chunk.
            chunks_.emplace_back ();
            size_ = 0;
        }